

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::PlainTemplated<bool,duckdb::TemplatedParquetValueConversion<bool>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  bool bVar1;
  uint8_t *in_RCX;
  ByteBuffer *in_RDX;
  ColumnReader *in_RSI;
  Vector *in_RDI;
  uint64_t in_R8;
  idx_t in_R9;
  
  bVar1 = HasDefines((ColumnReader *)0x8549e0);
  if ((bVar1) && (in_RDX != (ByteBuffer *)0x0)) {
    PlainTemplatedDefines<bool,duckdb::TemplatedParquetValueConversion<bool>,true>
              (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI);
  }
  else {
    PlainTemplatedDefines<bool,duckdb::TemplatedParquetValueConversion<bool>,false>
              (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI);
  }
  return;
}

Assistant:

void PlainTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                    Vector &result) {
		if (HasDefines() && defines) {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, true>(plain_data, defines, num_values, result_offset, result);
		} else {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, false>(plain_data, defines, num_values, result_offset,
			                                                     result);
		}
	}